

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_unittest_main.cc
# Opt level: O2

int main(int argc,char **argv)

{
  char *pcVar1;
  long lVar2;
  FlagSettingMode in_R8D;
  pointer pp_Var3;
  allocator local_a5;
  int local_a4;
  char **local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string local_78;
  string usage_message;
  char *test_argv [4];
  
  test_argv[2] = "3rd argv";
  test_argv[3] = "argv #4";
  test_argv[0] = "/test/argv/for/gflags_unittest";
  test_argv[1] = "argv 2";
  local_a4 = argc;
  local_a0 = argv;
  gflags::SetArgv(4,test_argv);
  pcVar1 = gflags::GetArgv0();
  std::__cxx11::string::string((string *)&local_98,pcVar1,(allocator *)&local_78);
  std::operator+(&usage_message,&local_98,": <useless flag> [...]\nDoes something useless.\n");
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::assign(fLS::FLAGS_tryfromenv_abi_cxx11_);
  setenv("FLAGS_test_tryfromenv","pre-set",1);
  gflags::SetCommandLineOptionWithMode_abi_cxx11_
            (&local_98,(gflags *)"changed_bool1","true",(char *)0x2,in_R8D);
  std::__cxx11::string::~string((string *)&local_98);
  fLB::FLAGS_changed_bool2 = 1;
  gflags::SetUsageMessage(&usage_message);
  std::__cxx11::string::string((string *)&local_78,"test_version",&local_a5);
  gflags::SetVersionString(&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  gflags::ParseCommandLineFlags(&local_a4,&local_a0,true);
  gflags::MakeTmpdir(fLS::FLAGS_test_tmpdir_abi_cxx11_);
  if (argc == 1) {
    fwrite("Running the unit tests now...\n\n",0x1f,1,_stdout);
    fflush(_stdout);
    lVar2 = -(long)g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
                   super__Vector_impl_data._M_start;
    for (pp_Var3 = g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
                   super__Vector_impl_data._M_start;
        pp_Var3 !=
        g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
        super__Vector_impl_data._M_finish; pp_Var3 = pp_Var3 + 1) {
      (**pp_Var3)();
      lVar2 = lVar2 + -8;
    }
    fprintf(_stderr,"\nPassed %d tests\n\nPASS\n",
            (ulong)-(lVar2 + (long)g_testlist.
                                   super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>.
                                   _M_impl.super__Vector_impl_data._M_start) >> 3 & 0xffffffff);
  }
  else {
    fwrite("\n\nPASS\n",7,1,_stderr);
  }
  gflags::ShutDownCommandLineFlags();
  std::__cxx11::string::~string((string *)&usage_message);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  return GFLAGS_NAMESPACE::main(argc, argv);
}